

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gms_matcher.h
# Opt level: O0

void __thiscall gms_matcher::SetScale(gms_matcher *this,int Scale)

{
  MatExpr local_178 [356];
  int local_14;
  gms_matcher *pgStack_10;
  int Scale_local;
  gms_matcher *this_local;
  
  (this->mGridSizeRight).width = (int)((double)(this->mGridSizeLeft).width * mScaleRatios[Scale]);
  (this->mGridSizeRight).height = (int)((double)(this->mGridSizeLeft).height * mScaleRatios[Scale]);
  this->mGridNumberRight = (this->mGridSizeRight).width * (this->mGridSizeRight).height;
  local_14 = Scale;
  pgStack_10 = this;
  cv::Mat::zeros((int)local_178,this->mGridNumberRight,9);
  cv::Mat::operator=(&this->mGridNeighborRight,local_178);
  cv::MatExpr::~MatExpr(local_178);
  InitalizeNiehbors(this,&this->mGridNeighborRight,&this->mGridSizeRight);
  return;
}

Assistant:

void SetScale(int Scale) {
		// Set Scale
		mGridSizeRight.width = mGridSizeLeft.width  * mScaleRatios[Scale];
		mGridSizeRight.height = mGridSizeLeft.height * mScaleRatios[Scale];
		mGridNumberRight = mGridSizeRight.width * mGridSizeRight.height;

		// Initialize the neihbor of right grid 
		mGridNeighborRight = Mat::zeros(mGridNumberRight, 9, CV_32SC1);
		InitalizeNiehbors(mGridNeighborRight, mGridSizeRight);
	}